

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O2

void av1_loop_restoration_filter_frame_init
               (AV1LrStruct *lr_ctxt,YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,
               int num_planes)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  aom_bit_depth_t aVar4;
  RestorationType RVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  int iVar7;
  int iVar8;
  uint use_highbitdepth;
  AV1_COMMON *cm_00;
  long lVar9;
  int *piVar10;
  bool bVar11;
  ulong uVar12;
  int plane_h;
  int plane_w;
  AV1LrStruct *local_58;
  SequenceHeader *local_50;
  AV1_COMMON *local_48;
  long local_40;
  ulong local_38;
  
  local_50 = cm->seq_params;
  aVar4 = local_50->bit_depth;
  bVar3 = local_50->use_highbitdepth;
  lr_ctxt->dst = &cm->rst_frame;
  use_highbitdepth = (uint)bVar3;
  local_58 = lr_ctxt;
  iVar8 = aom_realloc_frame_buffer
                    (&cm->rst_frame,(frame->field_2).field_0.y_crop_width,
                     (frame->field_3).field_0.y_crop_height,local_50->subsampling_x,
                     local_50->subsampling_y,use_highbitdepth,0x20,(cm->features).byte_alignment,
                     (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,
                     false,0);
  if (iVar8 != 0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate restoration dst buffer");
  }
  local_58->on_rest_unit = filter_frame_on_unit;
  local_38 = 0;
  uVar12 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    uVar12 = local_38;
  }
  local_58->frame = frame;
  local_40 = uVar12 << 3;
  piVar10 = &local_58->ctxt[0].dst_stride;
  cm_00 = cm;
  local_48 = cm;
  for (lVar9 = 0; local_40 != lVar9; lVar9 = lVar9 + 8) {
    (&cm->rst_info[0].optimized_lr)[lVar9 * 2] = optimized_lr;
    RVar5 = (&cm->rst_info[0].frame_restoration_type)[lVar9 * 2];
    ((FilterFrameCtxt *)(piVar10 + -0xd))->rsi =
         (RestorationInfo *)((long)&cm->rst_info[0].frame_restoration_type + local_38);
    if (RVar5 != RESTORE_NONE) {
      bVar11 = lVar9 != 0;
      av1_get_upsampled_plane_size(cm_00,(uint)bVar11,&plane_w,&plane_h);
      iVar7 = plane_w;
      iVar8 = plane_h;
      av1_extend_frame(*(uint8_t **)((long)frame->store_buf_adr + lVar9 + -0x20),plane_w,plane_h,
                       *(int *)((long)frame->store_buf_adr + (ulong)bVar11 * 4 + -0x28),3,3,
                       use_highbitdepth);
      if (lVar9 == 0) {
        uVar12 = 0;
      }
      else {
        uVar1 = local_50->subsampling_x;
        uVar2 = local_50->subsampling_y;
        uVar12 = ~CONCAT44(-(uint)(uVar2 == 0),-(uint)(uVar1 == 0)) & (ulong)DAT_0045f0e0;
      }
      *(ulong *)(piVar10 + -0xb) = uVar12;
      piVar10[-9] = iVar7;
      piVar10[-8] = iVar8;
      piVar10[-7] = use_highbitdepth;
      piVar10[-6] = aVar4;
      *(uint8_t **)(piVar10 + -5) = *(uint8_t **)((long)frame->store_buf_adr + lVar9 + -0x20);
      pYVar6 = local_58->dst;
      *(uint8_t **)(piVar10 + -3) = *(uint8_t **)((long)pYVar6->store_buf_adr + lVar9 + -0x20);
      piVar10[-1] = *(int *)((long)frame->store_buf_adr + (ulong)bVar11 * 4 + -0x28);
      *piVar10 = *(int *)((long)pYVar6->store_buf_adr + (ulong)bVar11 * 4 + -0x28);
      cm_00 = local_48;
    }
    piVar10 = piVar10 + 0xe;
    local_38 = local_38 + 0x40;
  }
  return;
}

Assistant:

void av1_loop_restoration_filter_frame_init(AV1LrStruct *lr_ctxt,
                                            YV12_BUFFER_CONFIG *frame,
                                            AV1_COMMON *cm, int optimized_lr,
                                            int num_planes) {
  const SequenceHeader *const seq_params = cm->seq_params;
  const int bit_depth = seq_params->bit_depth;
  const int highbd = seq_params->use_highbitdepth;
  lr_ctxt->dst = &cm->rst_frame;

  const int frame_width = frame->crop_widths[0];
  const int frame_height = frame->crop_heights[0];
  if (aom_realloc_frame_buffer(
          lr_ctxt->dst, frame_width, frame_height, seq_params->subsampling_x,
          seq_params->subsampling_y, highbd, AOM_RESTORATION_FRAME_BORDER,
          cm->features.byte_alignment, NULL, NULL, NULL, false,
          0) != AOM_CODEC_OK)
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate restoration dst buffer");

  lr_ctxt->on_rest_unit = filter_frame_on_unit;
  lr_ctxt->frame = frame;
  for (int plane = 0; plane < num_planes; ++plane) {
    RestorationInfo *rsi = &cm->rst_info[plane];
    RestorationType rtype = rsi->frame_restoration_type;
    rsi->optimized_lr = optimized_lr;
    lr_ctxt->ctxt[plane].rsi = rsi;

    if (rtype == RESTORE_NONE) {
      continue;
    }

    const int is_uv = plane > 0;
    int plane_w, plane_h;
    av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);
    assert(plane_w == frame->crop_widths[is_uv]);
    assert(plane_h == frame->crop_heights[is_uv]);

    av1_extend_frame(frame->buffers[plane], plane_w, plane_h,
                     frame->strides[is_uv], RESTORATION_BORDER,
                     RESTORATION_BORDER, highbd);

    FilterFrameCtxt *lr_plane_ctxt = &lr_ctxt->ctxt[plane];
    lr_plane_ctxt->ss_x = is_uv && seq_params->subsampling_x;
    lr_plane_ctxt->ss_y = is_uv && seq_params->subsampling_y;
    lr_plane_ctxt->plane_w = plane_w;
    lr_plane_ctxt->plane_h = plane_h;
    lr_plane_ctxt->highbd = highbd;
    lr_plane_ctxt->bit_depth = bit_depth;
    lr_plane_ctxt->data8 = frame->buffers[plane];
    lr_plane_ctxt->dst8 = lr_ctxt->dst->buffers[plane];
    lr_plane_ctxt->data_stride = frame->strides[is_uv];
    lr_plane_ctxt->dst_stride = lr_ctxt->dst->strides[is_uv];
  }
}